

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

QImage * __thiscall QRasterBuffer::colorizeBitmap(QRasterBuffer *this,QImage *image,QColor *color)

{
  bool bVar1;
  ImageConversionFlag IVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  QImage *in_RDX;
  QImage *in_RDI;
  long in_FS_OFFSET;
  int x;
  QRgb *target;
  uchar *source;
  int y;
  int width;
  int height;
  QRgb bg;
  QRgb fg;
  QImage dest;
  QImage sourceImage;
  undefined4 in_stack_ffffffffffffff48;
  ImageConversionFlag in_stack_ffffffffffffff4c;
  QImage *this_00;
  QFlagsStorage<Qt::ImageConversionFlag> in_stack_ffffffffffffff6c;
  int iVar7;
  int local_80;
  undefined1 local_40 [16];
  QImageData *local_30;
  undefined1 local_20 [16];
  QImageData *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QFlags<Qt::ImageConversionFlag>::QFlags
            ((QFlags<Qt::ImageConversionFlag> *)in_RDI,in_stack_ffffffffffffff4c);
  QImage::convertToFormat
            (this_00,(Format)((ulong)in_RDI >> 0x20),
             (ImageConversionFlags)in_stack_ffffffffffffff6c.i);
  local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QImage::size(in_RDI);
  QImage::QImage(in_RDX,(QSize *)this_00,(Format)((ulong)in_RDI >> 0x20));
  bVar1 = QImage::isNull((QImage *)local_20);
  if ((bVar1) || (bVar1 = QImage::isNull((QImage *)local_40), bVar1)) {
    QImage::QImage(in_RDX,this_00);
  }
  else {
    QColor::rgba((QColor *)in_RDX);
    IVar2 = qPremultiply((QRgb)((ulong)in_RDI >> 0x20));
    iVar3 = QImage::height((QImage *)local_20);
    iVar4 = QImage::width((QImage *)local_20);
    for (local_80 = 0; local_80 < iVar3; local_80 = local_80 + 1) {
      puVar5 = QImage::constScanLine((QImage *)local_20,local_80);
      puVar6 = QImage::scanLine(this_00,(int)((ulong)in_RDI >> 0x20));
      for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 1) {
        in_stack_ffffffffffffff4c = IVar2;
        if (((int)(uint)puVar5[iVar7 >> 3] >> ((byte)iVar7 & 7) & 1U) == 0) {
          in_stack_ffffffffffffff4c = AutoColor;
        }
        *(ImageConversionFlag *)(puVar6 + (long)iVar7 * 4) = in_stack_ffffffffffffff4c;
      }
    }
    QImage::QImage(in_RDI,(QImage *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  QImage::~QImage(in_RDI);
  QImage::~QImage(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QImage QRasterBuffer::colorizeBitmap(const QImage &image, const QColor &color)
{
    Q_ASSERT(image.depth() == 1);

    const QImage sourceImage = image.convertToFormat(QImage::Format_MonoLSB);
    QImage dest = QImage(sourceImage.size(), QImage::Format_ARGB32_Premultiplied);
    if (sourceImage.isNull() || dest.isNull())
        return image; // we must have run out of memory

    QRgb fg = qPremultiply(color.rgba());
    QRgb bg = 0;

    int height = sourceImage.height();
    int width = sourceImage.width();
    for (int y=0; y<height; ++y) {
        const uchar *source = sourceImage.constScanLine(y);
        QRgb *target = reinterpret_cast<QRgb *>(dest.scanLine(y));
        for (int x=0; x < width; ++x)
            target[x] = (source[x>>3] >> (x&7)) & 1 ? fg : bg;
    }
    return dest;
}